

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::Li
          (VolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Vector3f wi;
  Vector3f wi_00;
  LightSampleContext ctx;
  LightSampleContext ctx_00;
  Vector3f wiRender;
  undefined1 auVar9 [16];
  anon_class_128_16_8a10e554 func;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  bool bVar63;
  bool bVar64;
  uint32_t uVar65;
  SurfaceInteraction *pSVar66;
  ShapeIntersection *pSVar67;
  SubsurfaceInteraction *pSVar68;
  undefined8 in_RCX;
  int iVar69;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_FS_OFFSET;
  undefined1 auVar70 [64];
  Float FVar73;
  float fVar74;
  Point2f PVar75;
  undefined1 auVar71 [64];
  Float FVar72;
  undefined8 uVar83;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 extraout_var [56];
  undefined1 auVar79 [64];
  Vector3f *pVVar84;
  undefined8 uVar85;
  undefined1 extraout_var_00 [56];
  undefined1 auVar80 [64];
  RayDifferential *pRVar86;
  undefined1 extraout_var_01 [56];
  undefined1 auVar81 [64];
  RayDifferential *pRVar87;
  RayDifferential *pRVar88;
  undefined1 extraout_var_02 [56];
  undefined1 auVar82 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar90 [56];
  Vector3<float> VVar91;
  SampledSpectrum SVar92;
  SampledSpectrum SVar93;
  SampledSpectrum SVar94;
  Float q;
  SampledSpectrum rrBeta;
  BSDFSample bs_1;
  Float u_1;
  BSDF *bsdf_1;
  SurfaceInteraction pi;
  BSSRDFSample bssrdfSample;
  SubsurfaceInteraction ssi;
  optional<pbrt::ShapeIntersection> si_1;
  Ray r;
  Interaction base;
  WeightedReservoirSampler<pbrt::SubsurfaceInteraction> interactionSampler;
  uint64_t seed;
  BSSRDFProbeSegment probeSeg;
  BSSRDFHandle bssrdf;
  Float pdf;
  BSDFSample bs;
  Float u;
  Vector3f wo;
  BSDF bsdf;
  Float lightPDF_1;
  LightSampleContext prevIntrContext_1;
  LightHandle areaLight;
  SampledSpectrum Le;
  SurfaceInteraction *isect;
  Float lightPDF;
  LightSampleContext prevIntrContext;
  SampledSpectrum Le_1;
  LightHandle *light;
  const_iterator __end3;
  const_iterator __begin3;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range3;
  RNG rng;
  Float tMax;
  bool terminated;
  bool scattered;
  optional<pbrt::ShapeIntersection> si;
  int depth;
  optional<pbrt::MediumInteraction> prevMediumIntr;
  optional<pbrt::SurfaceInteraction> prevSurfaceIntr;
  Float etaScale;
  bool anyNonSpecularBounces;
  bool specularBounce;
  SampledSpectrum pdfNEE;
  SampledSpectrum pdfUni;
  SampledSpectrum beta;
  SampledSpectrum L;
  undefined1 auVar95 [16];
  undefined1 in_stack_ffffffffffffe968 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  LightSamplingMode in_stack_ffffffffffffe9ac;
  Vector3f *in_stack_ffffffffffffe9b0;
  Interaction *in_stack_ffffffffffffe9b8;
  int in_stack_ffffffffffffe9c4;
  undefined4 in_stack_ffffffffffffe9c8;
  undefined4 in_stack_ffffffffffffe9cc;
  undefined4 in_stack_ffffffffffffe9d0;
  float in_stack_ffffffffffffe9d4;
  SampledWavelengths *in_stack_ffffffffffffe9e0;
  BxDFReflTransFlags in_stack_ffffffffffffe9e8;
  TransportMode in_stack_ffffffffffffe9ec;
  int in_stack_ffffffffffffe9f0;
  Float in_stack_ffffffffffffe9f4;
  Ray *in_stack_ffffffffffffe9f8;
  Float in_stack_ffffffffffffea00;
  Float in_stack_ffffffffffffea04;
  undefined8 in_stack_ffffffffffffea08;
  float in_stack_ffffffffffffea10;
  undefined4 in_stack_ffffffffffffea14;
  undefined8 in_stack_ffffffffffffea18;
  undefined8 in_stack_ffffffffffffea20;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffea28;
  Float in_stack_ffffffffffffea34;
  float in_stack_ffffffffffffea38;
  float in_stack_ffffffffffffea3c;
  Point2f *in_stack_ffffffffffffea40;
  float in_stack_ffffffffffffea48;
  float in_stack_ffffffffffffea4c;
  undefined4 in_stack_ffffffffffffea50;
  Float in_stack_ffffffffffffea54;
  RayDifferential *in_stack_ffffffffffffea58;
  undefined6 in_stack_ffffffffffffea60;
  undefined1 in_stack_ffffffffffffea66;
  undefined1 in_stack_ffffffffffffea67;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffea68;
  undefined4 in_stack_ffffffffffffea74;
  undefined8 in_stack_ffffffffffffea78;
  undefined8 in_stack_ffffffffffffea80;
  BSDFSample *in_stack_ffffffffffffea88;
  ScratchBuffer *in_stack_ffffffffffffeaf8;
  RayDifferential *in_stack_ffffffffffffeb00;
  undefined8 in_stack_ffffffffffffeb08;
  RayDifferential *in_stack_ffffffffffffeb10;
  undefined8 in_stack_ffffffffffffeb18;
  undefined1 in_stack_ffffffffffffecf8 [16];
  SampledWavelengths *in_stack_ffffffffffffed08;
  RayDifferential *in_stack_ffffffffffffed10;
  SurfaceInteraction *in_stack_ffffffffffffed18;
  undefined7 in_stack_ffffffffffffed30;
  undefined1 in_stack_ffffffffffffed37;
  float in_stack_fffffffffffff05c;
  Vector3f *in_stack_fffffffffffff060;
  undefined1 in_stack_fffffffffffff068 [16];
  SurfaceInteraction *in_stack_fffffffffffff078;
  Float local_ef4;
  float local_ec4;
  float local_ec0;
  float local_ebc;
  undefined8 local_eb8;
  undefined8 local_eb0;
  undefined8 local_ea8;
  undefined8 local_ea0;
  SampledSpectrum *in_stack_fffffffffffff1a8;
  SamplerHandle *in_stack_fffffffffffff1b0;
  SampledWavelengths *in_stack_fffffffffffff1b8;
  BSDF *in_stack_fffffffffffff1c0;
  Interaction *in_stack_fffffffffffff1c8;
  VolPathIntegrator *in_stack_fffffffffffff1d0;
  SampledSpectrum *in_stack_fffffffffffff1f0;
  BSDFSample local_e00;
  Float local_ddc;
  undefined8 local_dd8;
  undefined8 local_dd0;
  undefined8 local_dc0;
  undefined8 local_db8;
  undefined8 local_db0;
  undefined8 local_da8;
  undefined1 *local_da0;
  SampledSpectrum *local_d7c;
  undefined4 local_d74;
  undefined8 local_ca0;
  undefined8 local_c98;
  undefined8 local_c90;
  undefined8 local_c88;
  float local_c70;
  undefined1 auStack_c68 [64];
  SampledSpectrum *local_c28;
  undefined4 local_c20;
  undefined1 local_c18 [32];
  undefined1 local_bf8 [32];
  undefined1 auStack_bd8 [32];
  SubsurfaceInteraction local_bb0;
  optional local_b50 [268];
  Vector3<float> local_a44 [2];
  Tuple3<pbrt::Vector3,_float> local_a2c [9];
  WeightedReservoirSampler<pbrt::SubsurfaceInteraction> local_9b8;
  uint64_t local_940;
  undefined8 local_938;
  BSSRDFProbeSegment local_930;
  TaggedPointer local_908 [104];
  Tuple3<pbrt::Vector3,_float> local_8a0;
  undefined8 local_890;
  float local_888;
  Tuple3<pbrt::Vector3,_float> local_880;
  undefined8 local_870;
  float local_868;
  Float local_864;
  undefined8 local_860;
  undefined8 local_858;
  undefined8 local_850;
  float local_848;
  undefined8 local_840;
  undefined8 local_838;
  float local_830;
  BSDFSample local_828;
  Float local_804;
  undefined8 local_800;
  float local_7f8;
  undefined8 local_7f0;
  float local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined1 local_7a8 [16];
  float local_798;
  undefined8 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined4 local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_6c0;
  float local_6ac;
  undefined1 local_6a8 [48];
  LightSampleContext local_678;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  float local_5c8;
  undefined8 local_5c0;
  float local_5b8;
  undefined8 local_5b0;
  undefined8 local_5a8;
  ShapeIntersection *local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined4 local_540;
  undefined8 local_538;
  undefined4 local_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  float local_4e4;
  undefined1 local_4e0 [48];
  LightSampleContext local_4b0;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  reference local_400;
  LightHandle *local_3f8;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_3f0;
  long local_3e8;
  int local_3dc;
  undefined1 *local_3d8;
  byte *pbStack_3d0;
  undefined8 *puStack_3c8;
  undefined8 *puStack_3c0;
  int *piStack_3b8;
  array<float,_4> *paStack_3a8;
  undefined8 uStack_3a0;
  undefined1 *local_398;
  optional<pbrt::MediumInteraction> *poStack_380;
  optional<pbrt::SurfaceInteraction> *poStack_378;
  byte *pbStack_370;
  byte *pbStack_368;
  byte *pbStack_360;
  undefined1 local_358 [20];
  Float local_344;
  byte local_33e;
  byte local_33d [13];
  optional local_330 [268];
  int local_224;
  optional<pbrt::MediumInteraction> local_220;
  optional<pbrt::SurfaceInteraction> local_180;
  float local_80;
  byte local_7a;
  byte local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [40];
  undefined8 local_28;
  array<float,_4> local_10;
  undefined1 auVar89 [56];
  
  local_28 = in_RDX;
  SampledSpectrum::SampledSpectrum(in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._4_4_);
  SampledSpectrum::SampledSpectrum(in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._4_4_);
  SampledSpectrum::SampledSpectrum(in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._4_4_);
  SampledSpectrum::SampledSpectrum(in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._4_4_);
  local_79 = 0;
  local_7a = 0;
  local_80 = 1.0;
  pstd::optional<pbrt::SurfaceInteraction>::optional(&local_180);
  pstd::optional<pbrt::MediumInteraction>::optional(&local_220);
  SVar93.values.values[2] = (float)(int)in_stack_ffffffffffffeb08;
  SVar93.values.values[3] = (float)(int)((ulong)in_stack_ffffffffffffeb08 >> 0x20);
  SVar93.values.values[0] = (float)(int)in_stack_ffffffffffffeb18;
  SVar93.values.values[1] = (float)(int)((ulong)in_stack_ffffffffffffeb18 >> 0x20);
  SVar94.values.values[2] = (float)(int)in_stack_ffffffffffffea08;
  SVar94.values.values[3] = (float)(int)((ulong)in_stack_ffffffffffffea08 >> 0x20);
  SVar94.values.values[0] = (float)(int)in_stack_ffffffffffffea18;
  SVar94.values.values[1] = (float)(int)((ulong)in_stack_ffffffffffffea18 >> 0x20);
  local_224 = 0;
  do {
    auVar76 = ZEXT464(0x7f800000);
    Integrator::Intersect
              (in_stack_ffffffffffffe968._32_8_,in_stack_ffffffffffffe968._24_8_,
               in_stack_ffffffffffffe968._20_4_);
    local_33d[0] = 0;
    local_33e = 0;
    bVar63 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 0x20));
    auVar95 = in_stack_ffffffffffffe968._0_16_;
    if (bVar63) {
      bVar63 = pstd::optional::operator_cast_to_bool(local_330);
      if (bVar63) {
        pSVar67 = pstd::optional<pbrt::ShapeIntersection>::operator->
                            ((optional<pbrt::ShapeIntersection> *)0x7e7720);
        local_ef4 = pSVar67->tHit;
      }
      else {
        local_ef4 = INFINITY;
      }
      local_344 = local_ef4;
      SamplerHandle::Get1D(auVar95._8_8_);
      Hash<float>(0.0);
      SamplerHandle::Get1D(auVar95._8_8_);
      Hash<float>(0.0);
      RNG::RNG(auVar95._8_8_,auVar95._0_8_,0x7e77e7);
      local_3d8 = local_50;
      pbStack_3d0 = &local_33e;
      puStack_3c8 = &local_60;
      puStack_3c0 = &local_78;
      piStack_3b8 = &local_224;
      paStack_3a8 = &local_10;
      uStack_3a0 = local_28;
      local_398 = local_358;
      poStack_380 = &local_220;
      poStack_378 = &local_180;
      pbStack_370 = local_33d;
      pbStack_368 = &local_79;
      pbStack_360 = &local_7a;
      auVar76._8_8_ = pbStack_3d0;
      auVar76._0_8_ = local_3d8;
      auVar76._16_8_ = puStack_3c8;
      auVar76._24_8_ = puStack_3c0;
      auVar76._32_8_ = piStack_3b8;
      auVar76._40_8_ = in_RDI;
      auVar76._48_8_ = paStack_3a8;
      auVar76._56_8_ = local_28;
      auVar71 = vmovdqu64_avx512f(auVar76);
      auVar70._8_8_ = in_RCX;
      auVar70._0_8_ = local_398;
      auVar70._16_8_ = in_RSI;
      auVar70._24_8_ = poStack_380;
      auVar70._32_8_ = poStack_378;
      auVar70._40_8_ = pbStack_370;
      auVar70._48_8_ = pbStack_368;
      auVar70._56_8_ = pbStack_360;
      auVar76 = vmovdqu64_avx512f(auVar70);
      auVar76 = vmovdqu64_avx512f(auVar76);
      in_stack_ffffffffffffe9ac = auVar76._4_4_;
      in_stack_ffffffffffffe9b0 = auVar76._8_8_;
      in_stack_ffffffffffffe9b8 = auVar76._16_8_;
      in_stack_ffffffffffffe9c4 = auVar76._28_4_;
      in_stack_ffffffffffffe9c8 = auVar76._32_4_;
      in_stack_ffffffffffffe9cc = auVar76._36_4_;
      in_stack_ffffffffffffe9d0 = auVar76._40_4_;
      in_stack_ffffffffffffe9d4 = auVar76._44_4_;
      in_stack_ffffffffffffe9e0 = auVar76._56_8_;
      in_stack_ffffffffffffe968 = vmovdqu64_avx512f(auVar71);
      auVar76 = ZEXT1664(SUB6416(ZEXT464(0),0));
      in_ZMM1 = ZEXT1664(auVar71._0_16_);
      func.beta._4_4_ = in_stack_ffffffffffffea14;
      func.beta._0_4_ = in_stack_ffffffffffffea10;
      func.terminated = (bool *)SVar94.values.values._0_8_;
      func.pdfUni = (SampledSpectrum *)in_stack_ffffffffffffea20;
      func._24_12_ = in_stack_ffffffffffffea28;
      func.depth._4_4_ = in_stack_ffffffffffffea34;
      func.this._0_4_ = in_stack_ffffffffffffea38;
      func.this._4_4_ = in_stack_ffffffffffffea3c;
      func.L = (SampledSpectrum *)in_stack_ffffffffffffea40;
      func.lambda._0_4_ = in_stack_ffffffffffffea48;
      func.lambda._4_4_ = in_stack_ffffffffffffea4c;
      func.rng._0_4_ = in_stack_ffffffffffffea50;
      func.rng._4_4_ = in_stack_ffffffffffffea54;
      func.sampler = (SamplerHandle *)in_stack_ffffffffffffea58;
      func.ray._0_6_ = in_stack_ffffffffffffea60;
      func.ray._6_1_ = in_stack_ffffffffffffea66;
      func.ray._7_1_ = in_stack_ffffffffffffea67;
      func._88_12_ = in_stack_ffffffffffffea68;
      func.prevSurfaceIntr._4_4_ = in_stack_ffffffffffffea74;
      func.scattered = (bool *)in_stack_ffffffffffffea78;
      func.specularBounce = (bool *)in_stack_ffffffffffffea80;
      func.anyNonSpecularBounces = (bool *)in_stack_ffffffffffffea88;
      MediumHandle::
      SampleTmaj<pbrt::VolPathIntegrator::Li(pbrt::RayDifferential,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::ScratchBuffer&,pbrt::VisibleSurface*)const::__0>
                ((MediumHandle *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
                 in_stack_ffffffffffffe9f8,in_stack_ffffffffffffe9f4,
                 (RNG *)CONCAT44(in_stack_ffffffffffffe9ec,in_stack_ffffffffffffe9e8),
                 in_stack_ffffffffffffe9e0,func);
    }
    if ((local_33e & 1) == 0) {
      if ((local_33d[0] & 1) == 0) {
        *(long *)(*in_FS_OFFSET + -0x330) = *(long *)(*in_FS_OFFSET + -0x330) + 1;
        if (0 < local_224) {
          bVar63 = pstd::optional<pbrt::SurfaceInteraction>::has_value(&local_180);
          bVar64 = pstd::optional<pbrt::MediumInteraction>::has_value(&local_220);
          if (bVar63 == bVar64) {
            LogFatal<char_const(&)[57]>
                      ((LogLevel)in_stack_ffffffffffffe9d4,
                       (char *)CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8),
                       in_stack_ffffffffffffe9c4,(char *)in_stack_ffffffffffffe9b8,
                       (char (*) [57])in_stack_ffffffffffffe9b0);
          }
        }
        bVar63 = pstd::optional::operator_cast_to_bool(local_330);
        auVar90 = auVar76._8_56_;
        if (bVar63) {
          local_5a0 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                ((optional<pbrt::ShapeIntersection> *)0x7e809f);
          VVar91 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_ffffffffffffe968._8_8_);
          local_5c8 = VVar91.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar71._0_8_ = VVar91.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar71._8_56_ = auVar90;
          uVar83 = 0;
          pRVar86 = auVar90._0_8_;
          local_5d0 = vmovlpd_avx(auVar71._0_16_);
          local_5c0 = local_5d0;
          local_5b8 = local_5c8;
          SVar92 = SurfaceInteraction::Le
                             (in_stack_ffffffffffffe968._56_8_,in_stack_ffffffffffffe968._48_8_,
                              in_stack_ffffffffffffe968._40_8_);
          auVar95._8_8_ = pRVar86;
          auVar95._0_8_ = SVar92.values.values._8_8_;
          auVar48._8_8_ = uVar83;
          auVar48._0_8_ = SVar92.values.values._0_8_;
          in_ZMM1 = ZEXT1664(auVar48);
          local_5b0 = vmovlpd_avx(auVar48);
          local_5a8 = vmovlpd_avx(auVar95);
          bVar63 = SampledSpectrum::operator_cast_to_bool(in_stack_ffffffffffffe968._16_8_);
          auVar90 = in_ZMM1._8_56_;
          if (bVar63) {
            if ((local_224 == 0) || ((local_79 & 1) != 0)) {
              SVar92 = SampledSpectrum::operator*
                                 (in_stack_ffffffffffffe968._16_8_,in_stack_ffffffffffffe968._8_8_);
              auVar4._8_56_ = auVar90;
              auVar4._0_8_ = SVar92.values.values._8_8_;
              auVar47._8_8_ = pRVar86;
              auVar47._0_8_ = SVar92.values.values._0_8_;
              local_5f0 = vmovlpd_avx(auVar47);
              local_5e8 = vmovlpd_avx(auVar4._0_16_);
              SampledSpectrum::Average(in_stack_ffffffffffffe968._8_8_);
              auVar90 = extraout_var_01;
              SVar92 = SampledWavelengths::PDF(in_stack_ffffffffffffe968._8_8_);
              auVar81._0_8_ = SVar92.values.values._0_8_;
              auVar81._8_56_ = auVar90;
              pRVar87 = (RayDifferential *)0x0;
              auVar46._8_8_ = pRVar86;
              auVar46._0_8_ = SVar92.values.values._8_8_;
              local_610 = vmovlpd_avx(auVar81._0_16_);
              local_608 = vmovlpd_avx(auVar46);
              pRVar88 = pRVar86;
              SVar92 = pbrt::operator*(in_stack_ffffffffffffe968._12_4_,
                                       in_stack_ffffffffffffe968._0_8_);
              auVar44._8_8_ = pRVar88;
              auVar44._0_8_ = SVar92.values.values._8_8_;
              auVar45._8_8_ = pRVar87;
              auVar45._0_8_ = SVar92.values.values._0_8_;
              local_600 = vmovlpd_avx(auVar45);
              local_5f8 = vmovlpd_avx(auVar44);
              pRVar86 = pRVar87;
              SVar92 = SafeDiv(in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
              auVar42._8_8_ = pRVar86;
              auVar42._0_8_ = SVar92.values.values._8_8_;
              auVar43._8_8_ = pRVar88;
              auVar43._0_8_ = SVar92.values.values._0_8_;
              in_ZMM1 = ZEXT1664(auVar43);
              local_5e0 = vmovlpd_avx(auVar43);
              local_5d8 = vmovlpd_avx(auVar42);
              SampledSpectrum::operator+=
                        (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
            }
            else {
              LightHandle::LightHandle
                        ((LightHandle *)in_stack_ffffffffffffe968._8_8_,
                         in_stack_ffffffffffffe968._0_8_);
              LightSampleContext::LightSampleContext(in_stack_ffffffffffffe968._8_8_);
              bVar63 = pstd::optional::operator_cast_to_bool((optional *)&local_180);
              if (bVar63) {
                pSVar66 = pstd::optional<pbrt::SurfaceInteraction>::operator*
                                    ((optional<pbrt::SurfaceInteraction> *)0x7e837f);
                LightSampleContext::LightSampleContext(&local_678,pSVar66);
                memcpy(&local_648,&local_678,0x30);
              }
              else {
                pstd::optional<pbrt::MediumInteraction>::operator*
                          ((optional<pbrt::MediumInteraction> *)0x7e83c9);
                LightSampleContext::LightSampleContext
                          (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                memcpy(&local_648,local_6a8,0x30);
              }
              LightHandle::LightHandle
                        (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
              FVar72 = LightSamplerHandle::PDF
                                 (in_stack_ffffffffffffe968._40_8_,in_stack_ffffffffffffe968._32_8_,
                                  in_stack_ffffffffffffe968._24_8_);
              uStack_6c8 = uStack_628;
              uStack_6c0 = uStack_620;
              uStack_6e8 = local_648;
              uStack_6e0 = uStack_640;
              local_6d8 = uStack_638;
              uStack_6d0 = uStack_630;
              local_700 = *(undefined4 *)(in_RSI + 0x14);
              local_708 = *(undefined8 *)(in_RSI + 0xc);
              auVar97._0_16_ = in_stack_ffffffffffffe968._0_16_;
              auVar97._16_8_ = uStack_638;
              auVar97._24_8_ = uStack_630;
              auVar97._32_8_ = uStack_628;
              auVar97._48_16_ = in_stack_ffffffffffffe968._48_16_;
              auVar97._40_8_ = uStack_620;
              in_stack_ffffffffffffe968._8_8_ = uStack_640;
              in_stack_ffffffffffffe968._0_8_ = local_648;
              in_stack_ffffffffffffe968._16_8_ = uStack_638;
              in_stack_ffffffffffffe968._32_32_ = auVar97._32_32_;
              in_stack_ffffffffffffe968._24_8_ = uStack_630;
              ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
                   (float)in_stack_ffffffffffffe9e8;
              ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                   (Interval<float>)in_stack_ffffffffffffe9e0;
              ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
                   (float)in_stack_ffffffffffffe9ec;
              ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low =
                   (float)in_stack_ffffffffffffe9f0;
              ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = in_stack_ffffffffffffe9f4;
              ctx_00.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = in_stack_ffffffffffffe9f8;
              ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_ffffffffffffea00;
              ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_ffffffffffffea04;
              ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.y =
                   (float)(int)SVar94.values.values._8_8_;
              ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                   (float)(int)((ulong)SVar94.values.values._8_8_ >> 0x20);
              wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffe9d0;
              wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffe9cc;
              wi_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffe9d4;
              local_6f8 = local_708;
              local_6f0 = local_700;
              FVar73 = LightHandle::PDF_Li((LightHandle *)in_stack_ffffffffffffe9b0,ctx_00,wi_00,
                                           in_stack_ffffffffffffe9ac);
              uVar85 = 0;
              local_6ac = FVar72 * FVar73;
              uVar83 = 0;
              SampledSpectrum::operator*=
                        (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._20_4_);
              SVar92 = SampledSpectrum::operator*
                                 (in_stack_ffffffffffffe968._16_8_,in_stack_ffffffffffffe968._8_8_);
              auVar40._8_8_ = uVar85;
              auVar40._0_8_ = SVar92.values.values._8_8_;
              auVar41._8_8_ = uVar83;
              auVar41._0_8_ = SVar92.values.values._0_8_;
              local_728 = vmovlpd_avx(auVar41);
              local_720 = vmovlpd_avx(auVar40);
              SVar92 = SampledSpectrum::operator+
                                 (in_stack_ffffffffffffe968._16_8_,in_stack_ffffffffffffe968._8_8_);
              auVar38._8_8_ = uVar83;
              auVar38._0_8_ = SVar92.values.values._8_8_;
              auVar39._8_8_ = uVar85;
              auVar39._0_8_ = SVar92.values.values._0_8_;
              local_748 = vmovlpd_avx(auVar39);
              local_740 = vmovlpd_avx(auVar38);
              SampledSpectrum::Average(in_stack_ffffffffffffe968._8_8_);
              auVar90 = extraout_var_02;
              SVar92 = SampledWavelengths::PDF(in_stack_ffffffffffffe968._8_8_);
              auVar82._0_8_ = SVar92.values.values._0_8_;
              auVar82._8_56_ = auVar90;
              pRVar86 = (RayDifferential *)0x0;
              auVar37._8_8_ = uVar85;
              auVar37._0_8_ = SVar92.values.values._8_8_;
              local_758 = vmovlpd_avx(auVar82._0_16_);
              local_750 = vmovlpd_avx(auVar37);
              SVar92 = pbrt::operator*(in_stack_ffffffffffffe968._12_4_,
                                       in_stack_ffffffffffffe968._0_8_);
              auVar35._8_8_ = uVar85;
              auVar35._0_8_ = SVar92.values.values._8_8_;
              auVar36._8_8_ = pRVar86;
              auVar36._0_8_ = SVar92.values.values._0_8_;
              local_738 = vmovlpd_avx(auVar36);
              local_730 = vmovlpd_avx(auVar35);
              SVar92 = SafeDiv(in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
              auVar33._8_8_ = pRVar86;
              auVar33._0_8_ = SVar92.values.values._8_8_;
              auVar34._8_8_ = uVar85;
              auVar34._0_8_ = SVar92.values.values._0_8_;
              in_ZMM1 = ZEXT1664(auVar34);
              local_718 = vmovlpd_avx(auVar34);
              local_710 = vmovlpd_avx(auVar33);
              SampledSpectrum::operator+=
                        (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
            }
          }
          CameraHandle::CameraHandle
                    (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
          auVar90 = in_stack_ffffffffffffe968._8_56_;
          SamplerHandle::SamplerHandle
                    (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
          in_stack_ffffffffffffe968._8_56_ = auVar90;
          in_stack_ffffffffffffe968._0_8_ = local_7a8;
          SurfaceInteraction::GetBSDF
                    (in_stack_ffffffffffffed18,in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,
                     in_stack_ffffffffffffecf8._8_8_,in_stack_ffffffffffffecf8._0_8_,
                     (SamplerHandle *)CONCAT17(in_stack_ffffffffffffed37,in_stack_ffffffffffffed30))
          ;
          bVar63 = BSDF::operator_cast_to_bool((BSDF *)0x7e879c);
          if (bVar63) {
            pstd::optional<pbrt::SurfaceInteraction>::operator=
                      (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
            pstd::optional<pbrt::MediumInteraction>::reset(in_stack_ffffffffffffe968._8_8_);
            auVar90 = in_ZMM1._12_56_;
            iVar69 = local_224 + 1;
            if (local_224 < *(int *)(in_RDI + 0x68)) {
              local_224 = iVar69;
              if (((*(byte *)(in_RDI + 0x78) & 1) != 0) && ((local_7a & 1) != 0)) {
                in_FS_OFFSET[-0x6e] = in_FS_OFFSET[-0x6e] + 1;
                BSDF::Regularize((BSDF *)0x7e88a0);
              }
              in_FS_OFFSET[-0x6d] = in_FS_OFFSET[-0x6d] + 1;
              in_stack_ffffffffffffed37 = BSDF::IsNonSpecular(in_stack_ffffffffffffe968._8_8_);
              auVar89 = in_stack_ffffffffffffe968._8_56_;
              if ((bool)in_stack_ffffffffffffed37) {
                SamplerHandle::SamplerHandle
                          (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                in_stack_ffffffffffffe968._8_56_ = auVar89;
                in_stack_ffffffffffffe968._0_8_ = &local_60;
                SVar92 = SampleLd(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,
                                  in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                                  in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                                  in_stack_fffffffffffff1f0);
                auVar5._8_56_ = auVar90;
                auVar5._0_8_ = SVar92.values.values._8_8_;
                in_stack_ffffffffffffed08 = SVar92.values.values._0_8_;
                in_stack_ffffffffffffecf8 = auVar5._0_16_;
                pRVar88 = auVar90._0_8_;
                auVar32._8_8_ = pRVar86;
                auVar32._0_8_ = in_stack_ffffffffffffed08;
                local_7c8 = vmovlpd_avx(auVar32);
                local_7c0 = vmovlpd_avx(in_stack_ffffffffffffecf8);
                pRVar87 = pRVar86;
                in_stack_ffffffffffffed10 = pRVar86;
                SVar92 = SampledWavelengths::PDF(in_stack_ffffffffffffe968._8_8_);
                auVar30._8_8_ = pRVar87;
                auVar30._0_8_ = SVar92.values.values._8_8_;
                auVar31._8_8_ = pRVar88;
                auVar31._0_8_ = SVar92.values.values._0_8_;
                local_7e0 = vmovlpd_avx(auVar31);
                local_7d8 = vmovlpd_avx(auVar30);
                pRVar86 = pRVar88;
                SVar92 = SafeDiv(in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
                auVar28._8_8_ = pRVar86;
                auVar28._0_8_ = SVar92.values.values._8_8_;
                auVar29._8_8_ = pRVar87;
                auVar29._0_8_ = SVar92.values.values._0_8_;
                local_7b8 = vmovlpd_avx(auVar29);
                local_7b0 = vmovlpd_avx(auVar28);
                SampledSpectrum::operator+=
                          (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
              }
              VVar91 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_ffffffffffffe968._8_8_);
              local_7f8 = VVar91.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar27._8_8_ = pRVar86;
              auVar27._0_8_ = VVar91.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              local_800 = vmovlpd_avx(auVar27);
              local_7f0 = local_800;
              local_7e8 = local_7f8;
              local_804 = SamplerHandle::Get1D(in_stack_ffffffffffffe968._8_8_);
              local_830 = local_7e8;
              local_838 = local_7f0;
              PVar75 = SamplerHandle::Get2D(in_stack_ffffffffffffe968._0_8_);
              auVar26._8_8_ = extraout_XMM0_Qb;
              auVar26._0_4_ = PVar75.super_Tuple2<pbrt::Point2,_float>.x;
              auVar26._4_4_ = PVar75.super_Tuple2<pbrt::Point2,_float>.y;
              local_840 = vmovlpd_avx(auVar26);
              local_848 = local_830;
              local_850 = local_838;
              in_ZMM1 = ZEXT464(0);
              BSDF::Sample_f((BSDF *)CONCAT44(in_stack_ffffffffffffea54,in_stack_ffffffffffffea50),
                             (Vector3f)in_stack_ffffffffffffea68,in_stack_ffffffffffffea4c,
                             in_stack_ffffffffffffea40,(TransportMode)in_stack_ffffffffffffea3c,
                             (BxDFReflTransFlags)in_stack_ffffffffffffea38);
              bVar63 = BSDFSample::operator_cast_to_bool(&local_828);
              auVar90 = in_ZMM1._8_56_;
              if (bVar63) {
                AbsDot<float>(in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                uVar83 = 0;
                SVar92 = SampledSpectrum::operator*
                                   (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._4_4_)
                ;
                auVar6._8_56_ = auVar90;
                auVar6._0_8_ = SVar92.values.values._8_8_;
                auVar25._8_8_ = uVar83;
                auVar25._0_8_ = SVar92.values.values._0_8_;
                in_ZMM1 = ZEXT1664(auVar25);
                local_860 = vmovlpd_avx(auVar25);
                local_858 = vmovlpd_avx(auVar6._0_16_);
                SampledSpectrum::operator*=
                          (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
                local_78 = local_60;
                uStack_70 = uStack_58;
                bVar63 = BSDF::SampledPDFIsProportional((BSDF *)0x7e8c72);
                if (bVar63) {
                  local_868 = local_7e8;
                  local_870 = local_7f0;
                  local_880.z = local_828.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                  local_880.x = local_828.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                  local_880.y = local_828.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                  local_888 = local_7e8;
                  local_890 = local_7f0;
                  local_8a0.z = local_828.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                  local_8a0.x = local_828.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                  local_8a0.y = local_828.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffea10;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                       (float)(int)SVar94.values.values._8_8_;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                       (float)(int)((ulong)SVar94.values.values._8_8_ >> 0x20);
                  local_864 = BSDF::PDF((BSDF *)CONCAT44(in_stack_ffffffffffffe9f4,
                                                         in_stack_ffffffffffffe9f0),
                                        (Vector3f)in_stack_ffffffffffffea28,wiRender,
                                        in_stack_ffffffffffffe9ec,in_stack_ffffffffffffe9e8);
                  in_ZMM1 = ZEXT464(0);
                  SampledSpectrum::operator*=
                            (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._20_4_);
                  SampledSpectrum::operator*=
                            (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._20_4_);
                }
                else {
                  SampledSpectrum::operator*=
                            (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._20_4_);
                }
                rescale(in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_,
                        (SampledSpectrum *)0x7e8dce);
                local_79 = BSDFSample::IsSpecular((BSDFSample *)0x7e8ddd);
                bVar63 = BSDFSample::IsSpecular((BSDFSample *)0x7e8e03);
                local_7a = (local_7a | ~bVar63) & 1;
                bVar63 = BSDFSample::IsTransmission((BSDFSample *)0x7e8e34);
                if (bVar63) {
                  fVar74 = Sqr<float>(local_798);
                  local_80 = fVar74 * local_80;
                }
                SurfaceInteraction::SpawnRay
                          (in_stack_fffffffffffff078,in_stack_fffffffffffff068._8_8_,
                           in_stack_fffffffffffff068._0_8_,in_stack_fffffffffffff060,
                           (BxDFFlags)in_stack_fffffffffffff05c);
                RayDifferential::operator=
                          (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                CameraHandle::CameraHandle
                          (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                SurfaceInteraction::GetBSSRDF
                          (SVar93.values.values._0_8_,in_stack_ffffffffffffeb10,
                           SVar93.values.values._8_8_,(CameraHandle *)in_stack_ffffffffffffeb00,
                           in_stack_ffffffffffffeaf8);
                bVar63 = pbrt::TaggedPointer::operator_cast_to_bool(local_908);
                if ((bVar63) &&
                   (bVar63 = BSDFSample::IsTransmission((BSDFSample *)0x7e8f71), bVar63)) {
                  SamplerHandle::Get1D(in_stack_ffffffffffffe968._8_8_);
                  PVar75 = SamplerHandle::Get2D(in_stack_ffffffffffffe968._0_8_);
                  auVar24._8_8_ = extraout_XMM0_Qb_00;
                  auVar24._0_4_ = PVar75.super_Tuple2<pbrt::Point2,_float>.x;
                  auVar24._4_4_ = PVar75.super_Tuple2<pbrt::Point2,_float>.y;
                  in_ZMM1 = ZEXT1664(auVar24);
                  local_938 = vmovlpd_avx(auVar24);
                  BSSRDFHandle::Sample
                            (in_stack_ffffffffffffe968._56_8_,in_stack_ffffffffffffe968._52_4_,
                             in_stack_ffffffffffffe968._40_8_);
                  bVar63 = BSSRDFProbeSegment::operator_cast_to_bool(&local_930);
                  if (bVar63) {
                    SamplerHandle::Get1D(in_stack_ffffffffffffe968._8_8_);
                    uVar65 = FloatToBits(0.0);
                    local_940 = MixBits((ulong)uVar65);
                    WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::WeightedReservoirSampler
                              (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                    MediumHandle::TaggedPointer
                              (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                    Interaction::Interaction
                              (in_stack_ffffffffffffe968._40_8_,in_stack_ffffffffffffe968._32_8_,
                               in_stack_ffffffffffffe968._28_4_,in_stack_ffffffffffffe968._16_8_);
                    do {
                      Interaction::SpawnRayTo
                                (SVar94.values.values._8_8_,
                                 (Point3f *)
                                 CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00));
                      in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
                      Vector3<float>::Vector3
                                (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._4_4_,
                                 in_stack_ffffffffffffe968._0_4_,0.0);
                      bVar63 = Tuple3<pbrt::Vector3,_float>::operator==(local_a2c,local_a44);
                      if (bVar63) break;
                      Integrator::Intersect
                                (in_stack_ffffffffffffe968._32_8_,in_stack_ffffffffffffe968._24_8_,
                                 in_stack_ffffffffffffe968._20_4_);
                      bVar63 = pstd::optional::operator_cast_to_bool(local_b50);
                      if (bVar63) {
                        pstd::optional<pbrt::ShapeIntersection>::operator->
                                  ((optional<pbrt::ShapeIntersection> *)0x7e91ff);
                        Interaction::operator=
                                  (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                        pSVar67 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                            ((optional<pbrt::ShapeIntersection> *)0x7e922d);
                        bVar63 = TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                                 ::operator==(&(pSVar67->intr).material.
                                               super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                                              ,&(local_5a0->intr).material.
                                                super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                                             );
                        if (bVar63) {
                          pSVar67 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                              ((optional<pbrt::ShapeIntersection> *)0x7e927d);
                          SubsurfaceInteraction::SubsurfaceInteraction(&local_bb0,&pSVar67->intr);
                          WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::Add
                                    (in_stack_ffffffffffffe968._24_8_,
                                     in_stack_ffffffffffffe968._16_8_,
                                     in_stack_ffffffffffffe968._12_4_);
                        }
                        local_3dc = 0;
                      }
                      else {
                        local_3dc = 7;
                      }
                      pstd::optional<pbrt::ShapeIntersection>::~optional
                                ((optional<pbrt::ShapeIntersection> *)0x7e92d7);
                    } while (local_3dc == 0);
                    iVar69 = WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::HasSample
                                       (&local_9b8);
                    if (iVar69 == 0) {
                      local_3dc = 3;
                    }
                    else {
                      pSVar68 = WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::GetSample
                                          (&local_9b8);
                      auVar1._0_24_ = *(undefined1 (*) [24])&pSVar68->pi;
                      auVar1._24_12_ = *(undefined1 (*) [12])&pSVar68->n;
                      auVar1._36_12_ = *(undefined1 (*) [12])&pSVar68->dpdu;
                      auVar1._48_12_ = *(undefined1 (*) [12])&pSVar68->dpdv;
                      auVar1._60_4_ = (pSVar68->ns).super_Tuple3<pbrt::Normal3,_float>.x;
                      auVar70 = vmovdqu64_avx512f(auVar1);
                      auVar71 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                   &(pSVar68->n).super_Tuple3<pbrt::Normal3,_float>.
                                                    z);
                      auVar76 = vmovdqu64_avx512f(auVar71);
                      auStack_bd8 = auVar76._32_32_;
                      auVar76 = vmovdqu64_avx512f(auVar70);
                      local_c18 = auVar76._0_32_;
                      local_bf8 = auVar76._32_32_;
                      in_ZMM1 = ZEXT1664(auVar71._0_16_);
                      BSSRDFHandle::ProbeIntersectionToSample
                                (in_stack_ffffffffffffe968._48_8_,in_stack_ffffffffffffe968._40_8_,
                                 in_stack_ffffffffffffe968._32_8_);
                      bVar63 = SampledSpectrum::operator_cast_to_bool
                                         (in_stack_ffffffffffffe968._16_8_);
                      if (bVar63) {
                        in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
                        auVar90 = in_ZMM1._8_56_;
                        if ((local_c70 != 0.0) || (NAN(local_c70))) {
                          WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::WeightSum
                                    (&local_9b8);
                          uVar83 = 0;
                          SVar93 = SampledSpectrum::operator*
                                             (in_stack_ffffffffffffe968._8_8_,
                                              in_stack_ffffffffffffe968._4_4_);
                          auVar7._8_56_ = auVar90;
                          auVar7._0_8_ = SVar93.values.values._8_8_;
                          auVar23._8_8_ = uVar83;
                          auVar23._0_8_ = SVar93.values.values._0_8_;
                          local_ca0 = vmovlpd_avx(auVar23);
                          local_c98 = vmovlpd_avx(auVar7._0_16_);
                          pRVar86 = (RayDifferential *)0x0;
                          SVar93 = SampledSpectrum::operator/
                                             (in_stack_ffffffffffffe968._16_8_,
                                              in_stack_ffffffffffffe968._12_4_);
                          auVar21._8_8_ = uVar83;
                          auVar21._0_8_ = SVar93.values.values._8_8_;
                          auVar22._8_8_ = pRVar86;
                          auVar22._0_8_ = SVar93.values.values._0_8_;
                          local_c90 = vmovlpd_avx(auVar22);
                          local_c88 = vmovlpd_avx(auVar21);
                          SampledSpectrum::operator*=
                                    (in_stack_ffffffffffffe968._24_8_,
                                     in_stack_ffffffffffffe968._16_8_);
                          SubsurfaceInteraction::operator_cast_to_SurfaceInteraction
                                    (in_stack_ffffffffffffe968._16_8_);
                          local_da0 = auStack_c68;
                          local_d7c = local_c28;
                          local_d74 = local_c20;
                          local_7a = 1;
                          if ((*(byte *)(in_RDI + 0x78) & 1) == 0) {
                            *(long *)(*in_FS_OFFSET + -0x368) =
                                 *(long *)(*in_FS_OFFSET + -0x368) + 1;
                          }
                          else {
                            in_FS_OFFSET[-0x6e] = in_FS_OFFSET[-0x6e] + 1;
                            BSDF::Regularize((BSDF *)0x7e952d);
                          }
                          pstd::optional<pbrt::SurfaceInteraction>::operator=
                                    (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_
                                    );
                          bVar63 = pstd::optional<pbrt::MediumInteraction>::has_value(&local_220);
                          auVar90 = in_stack_ffffffffffffe968._8_56_;
                          if (bVar63) {
                            LogFatal<char_const(&)[28]>
                                      ((LogLevel)in_stack_ffffffffffffe9d4,
                                       (char *)CONCAT44(in_stack_ffffffffffffe9cc,
                                                        in_stack_ffffffffffffe9c8),
                                       in_stack_ffffffffffffe9c4,(char *)in_stack_ffffffffffffe9b8,
                                       (char (*) [28])in_stack_ffffffffffffe9b0);
                          }
                          SamplerHandle::SamplerHandle
                                    (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_
                                    );
                          in_stack_ffffffffffffe968._8_56_ = auVar90;
                          in_stack_ffffffffffffe968._0_8_ = &local_60;
                          SVar93 = SampleLd(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,
                                            in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
                                            in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                                            in_stack_fffffffffffff1f0);
                          auVar19._8_8_ = pRVar86;
                          auVar19._0_8_ = SVar93.values.values._8_8_;
                          auVar20._8_8_ = uVar83;
                          auVar20._0_8_ = SVar93.values.values._0_8_;
                          local_dc0 = vmovlpd_avx(auVar20);
                          local_db8 = vmovlpd_avx(auVar19);
                          in_stack_ffffffffffffeb10 = pRVar86;
                          SVar92 = SampledWavelengths::PDF(in_stack_ffffffffffffe968._8_8_);
                          in_stack_ffffffffffffeaf8 = SVar92.values.values._0_8_;
                          auVar17._8_8_ = uVar83;
                          auVar17._0_8_ = SVar92.values.values._8_8_;
                          auVar18._8_8_ = pRVar86;
                          auVar18._0_8_ = in_stack_ffffffffffffeaf8;
                          local_dd8 = vmovlpd_avx(auVar18);
                          local_dd0 = vmovlpd_avx(auVar17);
                          in_stack_ffffffffffffeb00 = pRVar86;
                          SVar92 = SafeDiv(in_stack_ffffffffffffe968._24_8_,
                                           in_stack_ffffffffffffe968._16_8_);
                          auVar15._8_8_ = pRVar86;
                          auVar15._0_8_ = SVar92.values.values._8_8_;
                          auVar16._8_8_ = uVar83;
                          auVar16._0_8_ = SVar92.values.values._0_8_;
                          local_db0 = vmovlpd_avx(auVar16);
                          local_da8 = vmovlpd_avx(auVar15);
                          SampledSpectrum::operator+=
                                    (in_stack_ffffffffffffe968._24_8_,
                                     in_stack_ffffffffffffe968._16_8_);
                          local_ddc = SamplerHandle::Get1D(in_stack_ffffffffffffe968._8_8_);
                          in_stack_fffffffffffff1f0 = local_d7c;
                          PVar75 = SamplerHandle::Get2D(in_stack_ffffffffffffe968._0_8_);
                          auVar14._8_8_ = extraout_XMM0_Qb_01;
                          auVar14._0_4_ = PVar75.super_Tuple2<pbrt::Point2,_float>.x;
                          auVar14._4_4_ = PVar75.super_Tuple2<pbrt::Point2,_float>.y;
                          vmovlpd_avx(auVar14);
                          in_ZMM1 = ZEXT464(0);
                          BSDF::Sample_f((BSDF *)CONCAT44(in_stack_ffffffffffffea54,
                                                          in_stack_ffffffffffffea50),
                                         (Vector3f)in_stack_ffffffffffffea68,
                                         in_stack_ffffffffffffea4c,in_stack_ffffffffffffea40,
                                         (TransportMode)in_stack_ffffffffffffea3c,
                                         (BxDFReflTransFlags)in_stack_ffffffffffffea38);
                          bVar63 = BSDFSample::operator_cast_to_bool(&local_e00);
                          auVar90 = in_ZMM1._8_56_;
                          if (bVar63) {
                            in_stack_ffffffffffffea88 = &local_e00;
                            AbsDot<float>(in_stack_ffffffffffffe968._8_8_,
                                          in_stack_ffffffffffffe968._0_8_);
                            in_stack_ffffffffffffea80 = 0;
                            SVar92 = SampledSpectrum::operator*
                                               (in_stack_ffffffffffffe968._8_8_,
                                                in_stack_ffffffffffffe968._4_4_);
                            auVar8._8_56_ = auVar90;
                            auVar8._0_8_ = SVar92.values.values._8_8_;
                            in_stack_ffffffffffffea78 = SVar92.values.values._0_8_;
                            in_stack_ffffffffffffea68 = auVar8._0_12_;
                            in_stack_ffffffffffffea74 = auVar90._4_4_;
                            auVar13._8_8_ = in_stack_ffffffffffffea80;
                            auVar13._0_8_ = in_stack_ffffffffffffea78;
                            in_ZMM1 = ZEXT1664(auVar13);
                            in_stack_fffffffffffff1c8 = (Interaction *)vmovlpd_avx(auVar13);
                            in_stack_fffffffffffff1d0 =
                                 (VolPathIntegrator *)vmovlpd_avx(auVar8._0_16_);
                            SampledSpectrum::operator*=
                                      (in_stack_ffffffffffffe968._24_8_,
                                       in_stack_ffffffffffffe968._16_8_);
                            local_78 = local_60;
                            uStack_70 = uStack_58;
                            SampledSpectrum::operator*=
                                      (in_stack_ffffffffffffe968._24_8_,
                                       in_stack_ffffffffffffe968._20_4_);
                            in_stack_ffffffffffffea67 =
                                 BSDFSample::IsSpecular((BSDFSample *)0x7e98f9);
                            local_79 = in_stack_ffffffffffffea67;
                            Interaction::SpawnRay
                                      (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
                            RayDifferential::operator=
                                      (in_stack_ffffffffffffe968._8_8_,
                                       in_stack_ffffffffffffe968._0_8_);
                            goto LAB_007e994a;
                          }
                          local_3dc = 3;
                          goto LAB_007e9b7e;
                        }
                      }
                      local_3dc = 3;
                    }
                  }
                  else {
                    local_3dc = 3;
                  }
                }
                else {
LAB_007e994a:
                  in_stack_ffffffffffffea66 =
                       SampledSpectrum::operator_cast_to_bool(in_stack_ffffffffffffe968._16_8_);
                  if ((bool)in_stack_ffffffffffffea66) {
                    uVar83 = 0;
                    in_stack_ffffffffffffea40 = in_ZMM1._8_8_;
                    SVar94 = SampledSpectrum::operator*
                                       (in_stack_ffffffffffffe968._8_8_,
                                        in_stack_ffffffffffffe968._4_4_);
                    in_stack_ffffffffffffea38 = SVar94.values.values[2];
                    in_stack_ffffffffffffea3c = SVar94.values.values[3];
                    in_stack_ffffffffffffea48 = SVar94.values.values[0];
                    in_stack_ffffffffffffea4c = SVar94.values.values[1];
                    in_stack_ffffffffffffea50 = (undefined4)uVar83;
                    in_stack_ffffffffffffea54 = (Float)((ulong)uVar83 >> 0x20);
                    auVar11._8_8_ = in_stack_ffffffffffffea40;
                    auVar11._0_8_ = SVar94.values.values._8_8_;
                    auVar12._8_4_ = in_stack_ffffffffffffea50;
                    auVar12._0_8_ = SVar94.values.values._0_8_;
                    auVar12._12_4_ = in_stack_ffffffffffffea54;
                    uVar83 = auVar12._8_8_;
                    local_eb8 = vmovlpd_avx(auVar12);
                    local_eb0 = vmovlpd_avx(auVar11);
                    in_stack_ffffffffffffea34 =
                         SampledSpectrum::Average(in_stack_ffffffffffffe968._8_8_);
                    in_stack_ffffffffffffea20 = 0;
                    SVar94 = SampledSpectrum::operator/
                                       (in_stack_ffffffffffffe968._16_8_,
                                        in_stack_ffffffffffffe968._12_4_);
                    in_stack_ffffffffffffea10 = (float)uVar83;
                    in_stack_ffffffffffffea14 = (undefined4)((ulong)uVar83 >> 0x20);
                    auVar9._8_4_ = in_stack_ffffffffffffea10;
                    auVar9._0_8_ = SVar94.values.values._8_8_;
                    auVar9._12_4_ = in_stack_ffffffffffffea14;
                    auVar10._8_8_ = in_stack_ffffffffffffea20;
                    auVar10._0_8_ = SVar94.values.values._0_8_;
                    local_ea8 = vmovlpd_avx(auVar10);
                    local_ea0 = vmovlpd_avx(auVar9);
                    in_stack_ffffffffffffea04 =
                         SampledSpectrum::MaxComponentValue(in_stack_ffffffffffffe968._8_8_);
                    in_ZMM1 = ZEXT464((uint)in_stack_ffffffffffffea04);
                    if ((in_stack_ffffffffffffea04 < *(float *)(in_RDI + 0x6c)) && (1 < local_224))
                    {
                      local_ec0 = 0.0;
                      in_stack_ffffffffffffea00 =
                           SampledSpectrum::MaxComponentValue(in_stack_ffffffffffffe968._8_8_);
                      local_ec4 = 1.0 - in_stack_ffffffffffffea00;
                      in_stack_ffffffffffffe9f8 = (Ray *)std::max<float>(&local_ec0,&local_ec4);
                      local_ebc = (in_stack_ffffffffffffe9f8->o).super_Tuple3<pbrt::Point3,_float>.x
                      ;
                      in_stack_ffffffffffffe9f4 =
                           SamplerHandle::Get1D(in_stack_ffffffffffffe968._8_8_);
                      in_ZMM1 = ZEXT464((uint)in_stack_ffffffffffffe9f4);
                      if (in_stack_ffffffffffffe9f4 < local_ebc) {
                        local_3dc = 3;
                        goto LAB_007e9b7e;
                      }
                      SampledSpectrum::operator*=
                                (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._20_4_);
                      in_ZMM1 = ZEXT464(0);
                      SampledSpectrum::operator*=
                                (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._20_4_);
                    }
                    local_3dc = 0;
                  }
                  else {
                    local_3dc = 3;
                  }
                }
              }
              else {
                local_3dc = 3;
              }
            }
            else {
              local_3dc = 1;
              local_224 = iVar69;
            }
          }
          else {
            pstd::optional<pbrt::ShapeIntersection>::operator->
                      ((optional<pbrt::ShapeIntersection> *)0x7e87cf);
            SurfaceInteraction::SkipIntersection
                      ((SurfaceInteraction *)
                       CONCAT17(in_stack_ffffffffffffea67,
                                CONCAT16(in_stack_ffffffffffffea66,in_stack_ffffffffffffea60)),
                       in_stack_ffffffffffffea58,in_stack_ffffffffffffea54);
            local_3dc = 2;
          }
        }
        else {
          local_3e8 = in_RDI + 0x28;
          local_3f0._M_current =
               (LightHandle *)
               std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                         (in_stack_ffffffffffffe968._0_8_);
          local_3f8 = (LightHandle *)
                      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
                                (in_stack_ffffffffffffe968._0_8_);
          while( true ) {
            auVar89 = auVar76._8_56_;
            bVar63 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
            auVar90 = in_ZMM1._8_56_;
            if (!bVar63) break;
            local_400 = __gnu_cxx::
                        __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                        ::operator*(&local_3f0);
            SVar92 = LightHandle::Le(in_stack_ffffffffffffe968._40_8_,
                                     in_stack_ffffffffffffe968._32_8_,
                                     in_stack_ffffffffffffe968._24_8_);
            auVar2._8_56_ = auVar90;
            auVar2._0_8_ = SVar92.values.values._8_8_;
            auVar77._0_8_ = SVar92.values.values._0_8_;
            auVar77._8_56_ = auVar89;
            auVar76 = ZEXT1664(auVar2._0_16_);
            in_ZMM1 = ZEXT1664(auVar77._0_16_);
            local_410 = vmovlpd_avx(auVar77._0_16_);
            local_408 = vmovlpd_avx(auVar2._0_16_);
            bVar63 = SampledSpectrum::operator_cast_to_bool(in_stack_ffffffffffffe968._16_8_);
            auVar90 = in_ZMM1._8_56_;
            auVar89 = auVar76._8_56_;
            if (bVar63) {
              if ((local_224 == 0) || ((local_79 & 1) != 0)) {
                SVar92 = SampledSpectrum::operator*
                                   (in_stack_ffffffffffffe968._16_8_,
                                    (SampledSpectrum *)in_stack_ffffffffffffe968._8_8_);
                auVar3._8_56_ = auVar90;
                auVar3._0_8_ = SVar92.values.values._8_8_;
                auVar78._0_8_ = SVar92.values.values._0_8_;
                auVar78._8_56_ = auVar89;
                pVVar84 = auVar89._0_8_;
                local_430 = vmovlpd_avx(auVar78._0_16_);
                local_428 = vmovlpd_avx(auVar3._0_16_);
                SampledSpectrum::Average(in_stack_ffffffffffffe968._8_8_);
                auVar90 = extraout_var;
                SVar92 = SampledWavelengths::PDF(in_stack_ffffffffffffe968._8_8_);
                auVar79._0_8_ = SVar92.values.values._0_8_;
                auVar79._8_56_ = auVar90;
                in_stack_fffffffffffff05c = SVar92.values.values[3];
                in_stack_fffffffffffff068 = auVar79._0_16_;
                uVar83 = 0;
                auVar62._8_8_ = pVVar84;
                auVar62._0_8_ = SVar92.values.values._8_8_;
                local_450 = vmovlpd_avx(in_stack_fffffffffffff068);
                local_448 = vmovlpd_avx(auVar62);
                in_stack_fffffffffffff060 = pVVar84;
                SVar92 = pbrt::operator*(in_stack_ffffffffffffe968._12_4_,
                                         in_stack_ffffffffffffe968._0_8_);
                auVar60._8_8_ = pVVar84;
                auVar60._0_8_ = SVar92.values.values._8_8_;
                auVar61._8_8_ = uVar83;
                auVar61._0_8_ = SVar92.values.values._0_8_;
                local_440 = vmovlpd_avx(auVar61);
                local_438 = vmovlpd_avx(auVar60);
                SVar92 = SafeDiv(in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
                auVar58._8_8_ = uVar83;
                auVar58._0_8_ = SVar92.values.values._8_8_;
                auVar76 = ZEXT1664(auVar58);
                auVar59._8_8_ = pVVar84;
                auVar59._0_8_ = SVar92.values.values._0_8_;
                in_ZMM1 = ZEXT1664(auVar59);
                local_420 = vmovlpd_avx(auVar59);
                local_418 = vmovlpd_avx(auVar58);
                SampledSpectrum::operator+=
                          (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
              }
              else {
                LightSampleContext::LightSampleContext(in_stack_ffffffffffffe968._8_8_);
                bVar63 = pstd::optional::operator_cast_to_bool((optional *)&local_180);
                if (bVar63) {
                  pSVar66 = pstd::optional<pbrt::SurfaceInteraction>::operator*
                                      ((optional<pbrt::SurfaceInteraction> *)0x7e7d05);
                  LightSampleContext::LightSampleContext(&local_4b0,pSVar66);
                  memcpy(&local_480,&local_4b0,0x30);
                }
                else {
                  pstd::optional<pbrt::MediumInteraction>::operator*
                            ((optional<pbrt::MediumInteraction> *)0x7e7d4f);
                  LightSampleContext::LightSampleContext
                            (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                  memcpy(&local_480,local_4e0,0x30);
                }
                LightHandle::LightHandle
                          (in_stack_ffffffffffffe968._8_8_,in_stack_ffffffffffffe968._0_8_);
                FVar72 = LightSamplerHandle::PDF
                                   (in_stack_ffffffffffffe968._40_8_,
                                    in_stack_ffffffffffffe968._32_8_,
                                    in_stack_ffffffffffffe968._24_8_);
                uStack_508 = uStack_460;
                uStack_500 = uStack_458;
                uStack_528 = local_480;
                uStack_520 = uStack_478;
                local_518 = uStack_470;
                uStack_510 = uStack_468;
                local_540 = *(undefined4 *)(in_RSI + 0x14);
                local_548 = *(undefined8 *)(in_RSI + 0xc);
                auVar96._0_16_ = in_stack_ffffffffffffe968._0_16_;
                auVar96._16_8_ = uStack_470;
                auVar96._24_8_ = uStack_468;
                auVar96._32_8_ = uStack_460;
                auVar96._48_16_ = in_stack_ffffffffffffe968._48_16_;
                auVar96._40_8_ = uStack_458;
                in_stack_ffffffffffffe968._8_8_ = uStack_478;
                in_stack_ffffffffffffe968._0_8_ = local_480;
                in_stack_ffffffffffffe968._16_8_ = uStack_470;
                in_stack_ffffffffffffe968._32_32_ = auVar96._32_32_;
                in_stack_ffffffffffffe968._24_8_ = uStack_468;
                ctx.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
                     (float)in_stack_ffffffffffffe9e8;
                ctx.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                     (Interval<float>)in_stack_ffffffffffffe9e0;
                ctx.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
                     (float)in_stack_ffffffffffffe9ec;
                ctx.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low =
                     (float)in_stack_ffffffffffffe9f0;
                ctx.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high =
                     in_stack_ffffffffffffe9f4;
                ctx.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = in_stack_ffffffffffffe9f8;
                ctx.n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_ffffffffffffea00;
                ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_ffffffffffffea04;
                ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)SVar94.values.values._8_8_
                ;
                ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                     (float)(int)((ulong)SVar94.values.values._8_8_ >> 0x20);
                wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffe9d0;
                wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffe9cc;
                wi.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffe9d4;
                local_538 = local_548;
                local_530 = local_540;
                FVar73 = LightHandle::PDF_Li((LightHandle *)in_stack_ffffffffffffe9b0,ctx,wi,
                                             in_stack_ffffffffffffe9ac);
                uVar85 = 0;
                local_4e4 = FVar72 * FVar73;
                uVar83 = 0;
                SampledSpectrum::operator*=
                          (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._20_4_);
                SVar92 = SampledSpectrum::operator*
                                   (in_stack_ffffffffffffe968._16_8_,in_stack_ffffffffffffe968._8_8_
                                   );
                auVar56._8_8_ = uVar85;
                auVar56._0_8_ = SVar92.values.values._8_8_;
                auVar57._8_8_ = uVar83;
                auVar57._0_8_ = SVar92.values.values._0_8_;
                local_568 = vmovlpd_avx(auVar57);
                local_560 = vmovlpd_avx(auVar56);
                SVar92 = SampledSpectrum::operator+
                                   (in_stack_ffffffffffffe968._16_8_,in_stack_ffffffffffffe968._8_8_
                                   );
                auVar54._8_8_ = uVar83;
                auVar54._0_8_ = SVar92.values.values._8_8_;
                auVar55._8_8_ = uVar85;
                auVar55._0_8_ = SVar92.values.values._0_8_;
                local_588 = vmovlpd_avx(auVar55);
                local_580 = vmovlpd_avx(auVar54);
                SampledSpectrum::Average(in_stack_ffffffffffffe968._8_8_);
                auVar90 = extraout_var_00;
                SVar92 = SampledWavelengths::PDF(in_stack_ffffffffffffe968._8_8_);
                auVar80._0_8_ = SVar92.values.values._0_8_;
                auVar80._8_56_ = auVar90;
                uVar83 = 0;
                auVar53._8_8_ = uVar85;
                auVar53._0_8_ = SVar92.values.values._8_8_;
                local_598 = vmovlpd_avx(auVar80._0_16_);
                local_590 = vmovlpd_avx(auVar53);
                SVar92 = pbrt::operator*(in_stack_ffffffffffffe968._12_4_,
                                         in_stack_ffffffffffffe968._0_8_);
                auVar51._8_8_ = uVar85;
                auVar51._0_8_ = SVar92.values.values._8_8_;
                auVar52._8_8_ = uVar83;
                auVar52._0_8_ = SVar92.values.values._0_8_;
                local_578 = vmovlpd_avx(auVar52);
                local_570 = vmovlpd_avx(auVar51);
                SVar92 = SafeDiv(in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
                auVar49._8_8_ = uVar83;
                auVar49._0_8_ = SVar92.values.values._8_8_;
                auVar76 = ZEXT1664(auVar49);
                auVar50._8_8_ = uVar85;
                auVar50._0_8_ = SVar92.values.values._0_8_;
                in_ZMM1 = ZEXT1664(auVar50);
                local_558 = vmovlpd_avx(auVar50);
                local_550 = vmovlpd_avx(auVar49);
                SampledSpectrum::operator+=
                          (in_stack_ffffffffffffe968._24_8_,in_stack_ffffffffffffe968._16_8_);
              }
            }
            __gnu_cxx::
            __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
            ::operator++(&local_3f0);
          }
          local_3dc = 3;
        }
      }
      else {
        local_3dc = 2;
      }
    }
    else {
      local_3dc = 1;
    }
LAB_007e9b7e:
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x7e9b8b);
    in_stack_ffffffffffffe9f0 = local_3dc;
    if ((local_3dc != 0) && (local_3dc != 2)) {
      if (local_3dc == 3) {
        local_3dc = 1;
      }
      pstd::optional<pbrt::MediumInteraction>::~optional
                ((optional<pbrt::MediumInteraction> *)0x7e9beb);
      pstd::optional<pbrt::SurfaceInteraction>::~optional
                ((optional<pbrt::SurfaceInteraction> *)0x7e9bf8);
      return (array<float,_4>)(array<float,_4>)local_10.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum VolPathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                      SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                      VisibleSurface *visibleSurface) const {
    // Declare state variables for volumetric path
    // NOTE: beta means something different here...
    SampledSpectrum L(0.f), beta(1.f), pdfUni(1.f), pdfNEE(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    Float etaScale = 1;
    pstd::optional<SurfaceInteraction> prevSurfaceIntr;
    pstd::optional<MediumInteraction> prevMediumIntr;
    int depth = 0;

    while (true) {
        // Sample segment of volumetric scattering path
        PBRT_DBG("%s\n", StringPrintf("Path tracer depth %d, current L = %s, beta = %s\n",
                                      depth, L, beta)
                             .c_str());
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample the participating medium
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(sampler.Get1D()), Hash(sampler.Get1D()));
            ray.medium.SampleTmaj(
                ray, tMax, rng, lambda, [&](const MediumSample &mediumSample) {
                    // Handle medium scattering event for ray
                    if (!beta) {
                        terminated = true;
                        return false;
                    }
                    rescale(beta, pdfUni, pdfNEE);
                    if (!mediumSample.intr) {
                        // Update _beta_ and _pdfUni_ for ray that escaped the medium
                        // FIXME: review this, esp the pdf...
                        beta *= mediumSample.Tmaj;
                        pdfUni *= mediumSample.Tmaj;
                        return false;
                    }
                    ++volumeInteractions;
                    const MediumInteraction &intr = *mediumSample.intr;
                    const SampledSpectrum &sigma_a = intr.sigma_a,
                                          &sigma_s = intr.sigma_s;
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    // Add emission from medium scattering event
                    if (depth < maxDepth)
                        L += SafeDiv(
                            beta * intr.Le * sigma_a,
                            (intr.sigma_maj[0] * pdfUni.Average()) * lambda.PDF());

                    // Compute medium event probabilities for interaction
                    Float pAbsorb = sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    CHECK_GE(1 - pAbsorb - pScatter, -1e-6);
                    // Sample medium scattering event type and update path
                    Float um = rng.Uniform<Float>();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption along ray path
                        // beta *= Tmaj * sigma_a;
                        // pdfUni *= Tmaj * sigma_a;
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering along ray path
                        if (depth++ >= maxDepth) {
                            terminated = true;
                            return false;
                        }
                        beta *= Tmaj * sigma_s;
                        pdfUni *= Tmaj * sigma_s;
                        // Sample direct lighting at volume scattering event
                        L += SafeDiv(
                            SampleLd(intr, nullptr, lambda, sampler, beta, pdfUni),
                            lambda.PDF());

                        // Sample indirect lighting at volume scattering event
                        PhaseFunctionSample ps =
                            intr.phase.Sample_p(-ray.d, sampler.Get2D());
                        if (!ps) {
                            terminated = true;
                            return false;
                        }
                        // Update ray path state for indirect volume scattering
                        beta *= ps.p;
                        pdfNEE = pdfUni;
                        pdfUni *= ps.pdf;
                        prevMediumIntr = intr;
                        prevSurfaceIntr.reset();
                        scattered = true;
                        ray = intr.SpawnRay(ps.wi);
                        specularBounce = false;
                        anyNonSpecularBounces = true;

                        return false;

                    } else {
                        // Handle null scattering along ray path
                        SampledSpectrum sigma_n = intr.sigma_n();
                        beta *= Tmaj * sigma_n;
                        pdfUni *= Tmaj * sigma_n;
                        pdfNEE *= Tmaj * intr.sigma_maj;
                        rescale(beta, pdfUni, pdfNEE);
                        return true;
                    }
                });
        }
        if (terminated)
            return L;
        if (scattered)
            continue;
        // Handle scattering at point on surface for volumetric path tracer
        ++surfaceInteractions;
        if (depth > 0)
            CHECK(prevSurfaceIntr.has_value() ^ prevMediumIntr.has_value());
        // Add emitted light at volume path vertex or from the environment
        if (!si) {
            // Accumulate contributions from infinite light sources
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (Le) {
                    if (depth == 0 || specularBounce)
                        L += SafeDiv(beta * Le, pdfUni.Average() * lambda.PDF());
                    else {
                        // Add infinite light contribution using both PDFs with MIS
                        LightSampleContext prevIntrContext;
                        if (prevSurfaceIntr)
                            prevIntrContext = LightSampleContext(*prevSurfaceIntr);
                        else
                            prevIntrContext = LightSampleContext(*prevMediumIntr);
                        Float lightPDF = lightSampler.PDF(prevIntrContext, light) *
                                         light.PDF_Li(prevIntrContext, ray.d,
                                                      LightSamplingMode::WithMIS);
                        pdfNEE *= lightPDF;
                        L += SafeDiv(beta * Le,
                                     (pdfUni + pdfNEE).Average() * lambda.PDF());
                    }
                }
            }

            break;
        }
        SurfaceInteraction &isect = si->intr;
        SampledSpectrum Le = isect.Le(-ray.d, lambda);
        if (Le) {
            // Add contribution of emission from intersected surface
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, pdfUni.Average() * lambda.PDF());
            else {
                // Add surface light contribution using both PDFs with MIS
                LightHandle areaLight(isect.areaLight);
                LightSampleContext prevIntrContext;
                if (prevSurfaceIntr)
                    prevIntrContext = LightSampleContext(*prevSurfaceIntr);
                else
                    prevIntrContext = LightSampleContext(*prevMediumIntr);
                Float lightPDF =
                    lightSampler.PDF(prevIntrContext, areaLight) *
                    areaLight.PDF_Li(prevIntrContext, ray.d, LightSamplingMode::WithMIS);
                pdfNEE *= lightPDF;
                L += SafeDiv(beta * Le, (pdfUni + pdfNEE).Average() * lambda.PDF());
            }
        }

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        prevSurfaceIntr = isect;
        prevMediumIntr.reset();
        // Terminate path if maximum depth reached
        if (depth++ >= maxDepth)
            return L;

        // Possibly regularize BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }
        ++totalBSDFs;

        // Sample illumination from lights to find attenuated path contribution
        if (bsdf.IsNonSpecular()) {
            L += SafeDiv(SampleLd(isect, &bsdf, lambda, sampler, beta, pdfUni),
                         lambda.PDF());
            DCHECK(IsInf(L.y(lambda)) == false);
        }

        // Sample BSDF to get new volumetric path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update _beta_ and PDFs for BSDF scattering
        beta *= bs.f * AbsDot(bs.wi, isect.shading.n);
        pdfNEE = pdfUni;
        if (bsdf.SampledPDFIsProportional()) {
            Float pdf = bsdf.PDF(wo, bs.wi);
            beta *= pdf / bs.pdf;
            pdfUni *= pdf;
        } else
            pdfUni *= bs.pdf;
        rescale(beta, pdfUni, pdfNEE);

        PBRT_DBG("%s\n", StringPrintf("Sampled BSDF, f = %s, pdf = %f -> beta = %s", bs.f,
                                      bs.pdf, beta)
                             .c_str());
        DCHECK(IsInf(beta.y(lambda)) == false);
        specularBounce = bs.IsSpecular();
        anyNonSpecularBounces |= !bs.IsSpecular();
        if (bs.IsTransmission())
            etaScale *= Sqr(bsdf.eta);
        ray = isect.SpawnRay(ray, bsdf, bs.wi, bs.flags);

        // Account for attenuated subsurface scattering, if applicable
        BSSRDFHandle bssrdf = isect.GetBSSRDF(ray, lambda, camera, scratchBuffer);
        if (bssrdf && bs.IsTransmission()) {
            // Sample BSSRDF probe segment to find exit point
            BSSRDFProbeSegment probeSeg = bssrdf.Sample(sampler.Get1D(), sampler.Get2D());
            if (!probeSeg)
                break;

            // Sample random intersection along BSSRDF probe segment
            uint64_t seed = MixBits(FloatToBits(sampler.Get1D()));
            WeightedReservoirSampler<SubsurfaceInteraction> interactionSampler(seed);
            // Intersect BSSRDF sampling ray against the scene geometry
            Interaction base(probeSeg.p0, probeSeg.time, (MediumHandle) nullptr);
            while (true) {
                Ray r = base.SpawnRayTo(probeSeg.p1);
                if (r.d == Vector3f(0, 0, 0))
                    break;
                pstd::optional<ShapeIntersection> si = Intersect(r, 1);
                if (!si)
                    break;
                base = si->intr;
                if (si->intr.material == isect.material)
                    interactionSampler.Add(SubsurfaceInteraction(si->intr), 1.f);
            }

            if (!interactionSampler.HasSample())
                break;

            // Convert probe intersection to _BSSRDFSample_ and update _beta_
            SubsurfaceInteraction ssi = interactionSampler.GetSample();
            BSSRDFSample bssrdfSample =
                bssrdf.ProbeIntersectionToSample(ssi, scratchBuffer);
            if (!bssrdfSample.S || bssrdfSample.pdf == 0)
                break;
            // Can ignore path pdf here as well since bssrdfSample.pdf
            // is non-spectral.
            beta *= bssrdfSample.S * interactionSampler.WeightSum() / bssrdfSample.pdf;
            SurfaceInteraction pi = ssi;
            BSDF &bsdf = bssrdfSample.bsdf;
            pi.wo = bssrdfSample.wo;

            // Possibly regularize subsurface BSDF and update _prevSurfaceIntr_
            anyNonSpecularBounces = true;
            if (regularize) {
                ++regularizedBSDFs;
                bsdf.Regularize();
            } else
                ++totalBSDFs;
            prevSurfaceIntr = pi;
            CHECK(!prevMediumIntr.has_value());

            // Account for attenuated direct subsurface scattering
            L +=
                SafeDiv(SampleLd(pi, &bsdf, lambda, sampler, beta, pdfUni), lambda.PDF());

            // Sample ray for indirect subsurface scattering
            Float u = sampler.Get1D();
            BSDFSample bs = bsdf.Sample_f(pi.wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs.f * AbsDot(bs.wi, pi.shading.n);
            pdfNEE = pdfUni;
            pdfUni *= bs.pdf;
            // don't increment depth this time...
            DCHECK(!IsInf(beta.y(lambda)));
            specularBounce = bs.IsSpecular();
            ray = RayDifferential(pi.SpawnRay(bs.wi));
        }

        // Possibly terminate volumetric path with Russian roulette
        if (!beta)
            break;
        SampledSpectrum rrBeta = beta * etaScale / pdfUni.Average();
        PBRT_DBG("%s\n",
                 StringPrintf("etaScale %f -> rrBeta %s", etaScale, rrBeta).c_str());
        if (rrBeta.MaxComponentValue() < rrThreshold && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            pdfUni *= 1 - q;
            pdfNEE *= 1 - q;
        }
    }
    return L;
}